

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

void duckdb_yyjson::yyjson_mut_doc_free(yyjson_mut_doc *doc)

{
  long in_RDI;
  yyjson_alc alc;
  yyjson_str_chunk *next;
  yyjson_str_chunk *chunk;
  yyjson_val_chunk *next_1;
  yyjson_val_chunk *chunk_1;
  undefined8 local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  long local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  long local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  long local_8;
  
  if (in_RDI != 0) {
    local_68 = *(undefined8 *)(in_RDI + 8);
    local_60 = *(undefined8 *)(in_RDI + 0x10);
    local_58 = *(code **)(in_RDI + 0x18);
    local_50 = *(undefined8 *)(in_RDI + 0x20);
    local_48 = in_RDI;
    memset((void *)(in_RDI + 8),0,0x20);
    local_28 = local_48 + 0x28;
    local_38 = *(undefined8 **)(local_48 + 0x48);
    local_30 = (undefined1 *)&local_68;
    while (local_38 != (undefined8 *)0x0) {
      local_40 = (undefined8 *)*local_38;
      (**(code **)(local_30 + 0x10))(*(undefined8 *)(local_30 + 0x18),local_38);
      local_38 = local_40;
    }
    local_8 = local_48 + 0x50;
    local_18 = *(undefined8 **)(local_48 + 0x70);
    local_10 = (undefined1 *)&local_68;
    while (local_18 != (undefined8 *)0x0) {
      local_20 = (undefined8 *)*local_18;
      (**(code **)(local_10 + 0x10))(*(undefined8 *)(local_10 + 0x18),local_18);
      local_18 = local_20;
    }
    (*local_58)(local_50,local_48);
  }
  return;
}

Assistant:

void yyjson_mut_doc_free(yyjson_mut_doc *doc) {
    if (doc) {
        yyjson_alc alc = doc->alc;
        memset(&doc->alc, 0, sizeof(alc));
        unsafe_yyjson_str_pool_release(&doc->str_pool, &alc);
        unsafe_yyjson_val_pool_release(&doc->val_pool, &alc);
        alc.free(alc.ctx, doc);
    }
}